

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncInput(xmlParserInputBufferPtr input,size_t *sizeOut)

{
  xmlBufPtr buf;
  xmlCharEncodingHandlerPtr pxVar1;
  xmlCharEncodingInputFunc p_Var2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  unsigned_long uVar8;
  char cVar9;
  ulong uVar10;
  xmlBufPtr buf_00;
  uint uVar11;
  ulong uVar12;
  ulong len;
  size_t len_00;
  int c_in;
  int c_out;
  int local_78;
  int local_74;
  xmlParserInputBufferPtr local_70;
  xmlBufPtr local_68;
  size_t local_60;
  xmlChar *local_58;
  long local_50;
  xmlBufPtr local_48;
  size_t *local_40;
  ulong local_38;
  
  buf_00 = input->buffer;
  buf = input->raw;
  uVar10 = *sizeOut;
  *sizeOut = 0;
  local_70 = input;
  sVar5 = xmlBufUse(buf);
  if (sVar5 != 0) {
    local_48 = buf;
    local_40 = sizeOut;
    local_58 = xmlBufContent(buf);
    local_60 = 0;
    uVar12 = 0;
    local_68 = buf_00;
LAB_0012ce92:
    sVar6 = xmlBufAvail(buf_00);
    if (0x3ffffffe < sVar6) {
      sVar6 = 0x3fffffff;
    }
    local_74 = (int)uVar10;
    if (sVar6 < uVar10) {
      local_74 = (int)sVar6;
    }
    local_78 = 0x3fffffff;
    if (sVar5 < 0x40000000) {
      local_78 = (int)sVar5;
    }
    pxVar1 = local_70->encoder;
    pxVar7 = xmlBufEnd(buf_00);
    p_Var2 = pxVar1->input;
    if (p_Var2 == (xmlCharEncodingInputFunc)0x0) {
      local_74 = 0;
      local_78 = 0;
      xmlBufAddLen(buf_00,0);
      len = 0xffffffff;
      iVar4 = 1;
      goto switchD_0012cf4d_caseD_ffffffff;
    }
    local_38 = uVar10;
    uVar3 = (*p_Var2)(pxVar7,&local_74,local_58,&local_78);
    uVar11 = (int)uVar3 >> 0x1f & uVar3;
    len = (ulong)uVar11;
    local_50 = (long)local_78;
    len_00 = (size_t)local_74;
    xmlBufAddLen(buf_00,len_00);
    uVar10 = local_38;
    buf_00 = local_68;
    iVar4 = 1;
    switch(uVar11) {
    case 0xfffffffc:
switchD_0012cf4d_caseD_fffffffc:
      iVar4 = 2;
      break;
    case 0xfffffffd:
    case 0:
      len = uVar12 + local_50;
      local_60 = local_60 + len_00;
      if ((sVar5 < 0x40000000) && (local_38 <= sVar6)) goto LAB_0012cfe1;
      cVar9 = (-1 < (int)uVar3 && sVar5 < 0x40000000 || uVar3 == 0xfffffffd && local_38 <= sVar6) *
              '\x03';
      if (((-1 >= (int)uVar3 || sVar5 >= 0x40000000) && (uVar3 != 0xfffffffd || local_38 > sVar6))
         && (uVar3 == 0xfffffffd)) {
        iVar4 = xmlBufGrow(local_68,0x1000);
        cVar9 = '\0';
        if (iVar4 < 0) {
          len = 0xfffffffc;
          goto switchD_0012cf4d_caseD_fffffffc;
        }
      }
      local_58 = local_58 + local_50;
      sVar5 = sVar5 - local_50;
      uVar10 = uVar10 - len_00;
      uVar12 = len;
      if (cVar9 != '\0') goto code_r0x0012cfdc;
      goto LAB_0012ce92;
    case 0xfffffffe:
      iVar4 = 0x51;
    }
switchD_0012cf4d_caseD_ffffffff:
    local_70->error = iVar4;
    goto LAB_0012d054;
  }
LAB_0012d013:
  len = 0;
LAB_0012d054:
  return (int)len;
code_r0x0012cfdc:
  if (cVar9 != '\x03') goto LAB_0012d054;
LAB_0012cfe1:
  xmlBufShrink(local_48,len);
  uVar8 = 0xffffffffffffffff;
  if (!CARRY8(len,local_70->rawconsumed)) {
    uVar8 = len + local_70->rawconsumed;
  }
  local_70->rawconsumed = uVar8;
  *local_40 = local_60;
  goto LAB_0012d013;
}

Assistant:

int
xmlCharEncInput(xmlParserInputBufferPtr input, size_t *sizeOut)
{
    xmlBufPtr out, in;
    const xmlChar *dataIn;
    size_t availIn;
    size_t maxOut;
    size_t totalIn, totalOut;
    int ret;

    out = input->buffer;
    in = input->raw;

    maxOut = *sizeOut;
    totalOut = 0;

    *sizeOut = 0;

    availIn = xmlBufUse(in);
    if (availIn == 0)
        return(0);
    dataIn = xmlBufContent(in);
    totalIn = 0;

    while (1) {
        size_t availOut;
        int completeOut, completeIn;
        int c_out, c_in;

        availOut = xmlBufAvail(out);
        if (availOut > INT_MAX / 2)
            availOut = INT_MAX / 2;

        if (availOut < maxOut) {
            c_out = availOut;
            completeOut = 0;
        } else {
            c_out = maxOut;
            completeOut = 1;
        }

        if (availIn > INT_MAX / 2) {
            c_in = INT_MAX / 2;
            completeIn = 0;
        } else {
            c_in = availIn;
            completeIn = 1;
        }

        ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                               dataIn, &c_in);

        totalIn += c_in;
        dataIn += c_in;
        availIn -= c_in;

        totalOut += c_out;
        maxOut -= c_out;
        xmlBufAddLen(out, c_out);

        if ((ret != XML_ENC_ERR_SUCCESS) && (ret != XML_ENC_ERR_SPACE)) {
            input->error = xmlEncConvertError(ret);
            return(ret);
        }

        if ((completeOut) && (completeIn))
            break;
        if ((completeOut) && (ret == XML_ENC_ERR_SPACE))
            break;
        if ((completeIn) && (ret == XML_ENC_ERR_SUCCESS))
            break;

        if (ret == XML_ENC_ERR_SPACE) {
            if (xmlBufGrow(out, 4096) < 0) {
                input->error = XML_ERR_NO_MEMORY;
                return(XML_ENC_ERR_MEMORY);
            }
        }
    }

    xmlBufShrink(in, totalIn);

    if (input->rawconsumed > ULONG_MAX - (unsigned long) totalIn)
        input->rawconsumed = ULONG_MAX;
    else
        input->rawconsumed += totalIn;

    *sizeOut = totalOut;
    return(XML_ERR_OK);
}